

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O3

void __thiscall test_CEAngle::test_CEAngle(test_CEAngle *this)

{
  CEAngle local_30;
  double local_20;
  
  CETestSuite::CETestSuite(&this->super_CETestSuite);
  *(undefined ***)this = &PTR__test_CEAngle_00144590;
  CEAngle::CEAngle(&this->base_);
  local_20 = 1.5707963267948966;
  CEAngle::CEAngle(&local_30,&local_20);
  CEAngle::operator=(&this->base_,&local_30);
  CEAngle::~CEAngle(&local_30);
  return;
}

Assistant:

test_CEAngle::test_CEAngle() :
    CETestSuite()
{
    // Let's use 45 degrees for the tests, or PI/2
    base_ = CEAngle(M_PI_2);
}